

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall
spdlog::details::registry::set_formatter
          (registry *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter)

{
  logger *this_00;
  __node_base *p_Var1;
  _Head_base<0UL,_spdlog::formatter_*,_false> local_30;
  
  std::mutex::lock(&this->logger_map_mutex_);
  std::__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            ((__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             &this->formatter_,
             (__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             formatter);
  p_Var1 = &(this->loggers_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    this_00 = (logger *)p_Var1[5]._M_nxt;
    (*((this->formatter_)._M_t.
       super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
       super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
       super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[3])
              (&local_30);
    logger::set_formatter
              (this_00,(unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                       &local_30);
    if (local_30._M_head_impl != (formatter *)0x0) {
      (*(local_30._M_head_impl)->_vptr_formatter[1])();
    }
    local_30._M_head_impl = (formatter *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_formatter(std::unique_ptr<formatter> formatter) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    formatter_ = std::move(formatter);
    for (auto &l : loggers_) {
        l.second->set_formatter(formatter_->clone());
    }
}